

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::ToPropertyDescriptorForProxyObjects
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  ScriptContext *pSVar3;
  bool bVar4;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  PropertyRecord *pPVar8;
  char16 *pcVar9;
  RecyclableObject *pRVar10;
  JavascriptLibrary *pJVar11;
  RecyclableObject *propertySpecObj;
  Var value;
  ScriptContext *scriptContext_local;
  PropertyDescriptor *descriptor_local;
  Var propertySpec_local;
  RecyclableObject *local_40;
  TypeId local_34;
  RecyclableObject *local_30;
  TypeId local_28;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_1;
  
  value = scriptContext;
  scriptContext_local = (ScriptContext *)descriptor;
  descriptor_local = (PropertyDescriptor *)propertySpec;
  BVar5 = IsObject(propertySpec);
  if (BVar5 == 0) {
    propertySpec_local._4_4_ = 0;
  }
  else {
    pRVar6 = VarTo<Js::RecyclableObject>(descriptor_local);
    BVar5 = HasProperty(pRVar6,0x194);
    if (BVar5 == 1) {
      BVar5 = GetProperty(pRVar6,0x194,&propertySpecObj,(ScriptContext *)value,
                          (PropertyValueInfo *)0x0);
      pSVar3 = scriptContext_local;
      if (BVar5 == 0) {
        PropertyDescriptor::SetEnumerable((PropertyDescriptor *)scriptContext_local,false);
      }
      else {
        BVar5 = JavascriptConversion::ToBoolean(propertySpecObj,(ScriptContext *)value);
        PropertyDescriptor::SetEnumerable((PropertyDescriptor *)pSVar3,(bool)(-(BVar5 != 0) & 1));
      }
    }
    BVar5 = HasProperty(pRVar6,0x195);
    if (BVar5 == 1) {
      BVar5 = GetProperty(pRVar6,0x195,&propertySpecObj,(ScriptContext *)value,
                          (PropertyValueInfo *)0x0);
      pSVar3 = scriptContext_local;
      if (BVar5 == 0) {
        PropertyDescriptor::SetConfigurable((PropertyDescriptor *)scriptContext_local,false);
      }
      else {
        BVar5 = JavascriptConversion::ToBoolean(propertySpecObj,(ScriptContext *)value);
        PropertyDescriptor::SetConfigurable((PropertyDescriptor *)pSVar3,(bool)(-(BVar5 != 0) & 1));
      }
    }
    BVar5 = HasProperty(pRVar6,0x197);
    if (BVar5 == 1) {
      BVar5 = GetProperty(pRVar6,0x197,&propertySpecObj,(ScriptContext *)value,
                          (PropertyValueInfo *)0x0);
      pSVar3 = scriptContext_local;
      if (BVar5 == 0) {
        pJVar11 = ScriptContext::GetLibrary((ScriptContext *)value);
        pRVar10 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
        PropertyDescriptor::SetValue((PropertyDescriptor *)pSVar3,pRVar10);
      }
      else {
        PropertyDescriptor::SetValue((PropertyDescriptor *)scriptContext_local,propertySpecObj);
      }
    }
    BVar5 = HasProperty(pRVar6,0x196);
    if (BVar5 == 1) {
      BVar5 = GetProperty(pRVar6,0x196,&propertySpecObj,(ScriptContext *)value,
                          (PropertyValueInfo *)0x0);
      pSVar3 = scriptContext_local;
      if (BVar5 == 0) {
        PropertyDescriptor::SetWritable((PropertyDescriptor *)scriptContext_local,false);
      }
      else {
        BVar5 = JavascriptConversion::ToBoolean(propertySpecObj,(ScriptContext *)value);
        PropertyDescriptor::SetWritable((PropertyDescriptor *)pSVar3,(bool)(-(BVar5 != 0) & 1));
      }
    }
    BVar5 = HasProperty(pRVar6,0x198);
    if (BVar5 == 1) {
      BVar5 = GetProperty(pRVar6,0x198,&propertySpecObj,(ScriptContext *)value,
                          (PropertyValueInfo *)0x0);
      pSVar3 = scriptContext_local;
      if (BVar5 == 0) {
        pJVar11 = ScriptContext::GetLibrary((ScriptContext *)value);
        pRVar10 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
        PropertyDescriptor::SetGetter((PropertyDescriptor *)pSVar3,pRVar10);
      }
      else {
        local_30 = propertySpecObj;
        if (propertySpecObj == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar4 = TaggedInt::Is(local_30);
        if (bVar4) {
          local_28 = TypeIds_FirstNumberType;
        }
        else {
          bVar4 = JavascriptNumber::Is_NoTaggedIntCheck(local_30);
          if (bVar4) {
            local_28 = TypeIds_Number;
          }
          else {
            pRStack_20 = UnsafeVarTo<Js::RecyclableObject>(local_30);
            if (pRStack_20 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_24 = RecyclableObject::GetTypeId(pRStack_20);
            if ((0x57 < (int)local_24) &&
               (BVar5 = RecyclableObject::IsExternal(pRStack_20), BVar5 == 0)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_28 = local_24;
          }
        }
        if ((local_28 != TypeIds_Undefined) &&
           (bVar4 = JavascriptConversion::IsCallable(propertySpecObj), pvVar2 = value, !bVar4)) {
          pPVar8 = ScriptContext::GetPropertyName((ScriptContext *)value,0x198);
          pcVar9 = PropertyRecord::GetBuffer(pPVar8);
          JavascriptError::ThrowTypeError((ScriptContext *)pvVar2,-0x7ff5ec45,pcVar9);
        }
        PropertyDescriptor::SetGetter((PropertyDescriptor *)scriptContext_local,propertySpecObj);
      }
    }
    BVar5 = HasProperty(pRVar6,0x19b);
    if (BVar5 == 1) {
      BVar5 = GetProperty(pRVar6,0x19b,&propertySpecObj,(ScriptContext *)value,
                          (PropertyValueInfo *)0x0);
      pSVar3 = scriptContext_local;
      if (BVar5 == 0) {
        pJVar11 = ScriptContext::GetLibrary((ScriptContext *)value);
        pRVar6 = JavascriptLibraryBase::GetUndefined(&pJVar11->super_JavascriptLibraryBase);
        PropertyDescriptor::SetSetter((PropertyDescriptor *)pSVar3,pRVar6);
      }
      else {
        local_40 = propertySpecObj;
        if (propertySpecObj == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        bVar4 = TaggedInt::Is(local_40);
        if (bVar4) {
          local_34 = TypeIds_FirstNumberType;
        }
        else {
          bVar4 = JavascriptNumber::Is_NoTaggedIntCheck(local_40);
          if (bVar4) {
            local_34 = TypeIds_Number;
          }
          else {
            pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_40);
            if (pRStack_10 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_14 = RecyclableObject::GetTypeId(pRStack_10);
            if ((0x57 < (int)local_14) &&
               (BVar5 = RecyclableObject::IsExternal(pRStack_10), BVar5 == 0)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                          "GetTypeId aValue has invalid TypeId");
              if (!bVar4) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            local_34 = local_14;
          }
        }
        if ((local_34 != TypeIds_Undefined) &&
           (bVar4 = JavascriptConversion::IsCallable(propertySpecObj), pvVar2 = value, !bVar4)) {
          pPVar8 = ScriptContext::GetPropertyName((ScriptContext *)value,0x19b);
          pcVar9 = PropertyRecord::GetBuffer(pPVar8);
          JavascriptError::ThrowTypeError((ScriptContext *)pvVar2,-0x7ff5ec45,pcVar9);
        }
        PropertyDescriptor::SetSetter((PropertyDescriptor *)scriptContext_local,propertySpecObj);
      }
    }
    propertySpec_local._4_4_ = 1;
  }
  return propertySpec_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptorForProxyObjects(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsObject(propertySpec))
        {
            return FALSE;
        }

        Var value;
        RecyclableObject* propertySpecObj = VarTo<RecyclableObject>(propertySpec);

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::enumerable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::enumerable, &value, scriptContext))
            {
                descriptor->SetEnumerable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetEnumerable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::configurable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::configurable, &value, scriptContext))
            {
                descriptor->SetConfigurable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetConfigurable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::value) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::value, &value, scriptContext))
            {
                descriptor->SetValue(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetValue(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::writable) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::writable, &value, scriptContext))
            {
                descriptor->SetWritable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetWritable(false);
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::get) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::get, &value, scriptContext))
            {
                if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::get)->GetBuffer());
                }
                descriptor->SetGetter(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetGetter(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        if (JavascriptOperators::HasProperty(propertySpecObj, PropertyIds::set) == TRUE)
        {
            if (JavascriptOperators::GetProperty(propertySpecObj, PropertyIds::set, &value, scriptContext))
            {
                if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::set)->GetBuffer());
                }
                descriptor->SetSetter(value);
            }
            else
            {
                // The proxy said we have the property, so we try to read the property and get the default value.
                descriptor->SetSetter(scriptContext->GetLibrary()->GetUndefined());
            }
        }

        return TRUE;
    }